

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O3

NDSTATUS NdVexExceptionChecks(INSTRUX *Instrux)

{
  byte bVar1;
  ND_UINT8 NVar2;
  ND_UINT32 NVar3;
  ND_UINT32 NVar4;
  ND_UINT32 NVar5;
  long lVar6;
  NDSTATUS NVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  byte abStack_38 [8];
  ND_UINT8 usedVects [32];
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = Instrux->Attributes;
  if ((((uVar8 >> 0x22 & 1) != 0) && (NVar7 = 0x80000032, ((Instrux->Exs).field_0x2 & 0xf) != 0)) ||
     (((uVar8 >> 0x23 & 1) != 0 && (NVar7 = 0x80000040, ((Instrux->Exs).field_0x2 & 0x10) != 0))))
  goto LAB_0015da1f;
  if (((char)uVar8 < '\0') && (Instrux->Category != ND_CAT_SCATTER)) {
    abStack_38[0] = 0;
    abStack_38[1] = 0;
    abStack_38[2] = 0;
    abStack_38[3] = 0;
    abStack_38[4] = 0;
    abStack_38[5] = 0;
    abStack_38[6] = 0;
    abStack_38[7] = 0;
    usedVects[0] = '\0';
    usedVects[1] = '\0';
    usedVects[2] = '\0';
    usedVects[3] = '\0';
    usedVects[4] = '\0';
    usedVects[5] = '\0';
    usedVects[6] = '\0';
    usedVects[7] = '\0';
    usedVects[8] = '\0';
    usedVects[9] = '\0';
    usedVects[10] = '\0';
    usedVects[0xb] = '\0';
    usedVects[0xc] = '\0';
    usedVects[0xd] = '\0';
    usedVects[0xe] = '\0';
    usedVects[0xf] = '\0';
    usedVects[0x10] = '\0';
    usedVects[0x11] = '\0';
    usedVects[0x12] = '\0';
    usedVects[0x13] = '\0';
    usedVects[0x14] = '\0';
    usedVects[0x15] = '\0';
    usedVects[0x16] = '\0';
    usedVects[0x17] = '\0';
    bVar1 = Instrux->field_0x39;
    if ((bVar1 & 0xf) != 0) {
      uVar8 = 0;
      do {
        bVar9 = (&Instrux->Operands[0].field_0x0)[uVar8] & 0xf;
        if (bVar9 == 2) {
          uVar10 = (ulong)*(byte *)((long)&Instrux->Operands[0].Info + uVar8 + 0xb);
LAB_0015d947:
          NVar2 = usedVects[uVar10 - 8];
          usedVects[uVar10 - 8] = NVar2 + 1;
          if (1 < (byte)(NVar2 + 1)) {
            NVar7 = 0x80000031;
            goto LAB_0015da1f;
          }
        }
        else if ((bVar9 == 1) && (*(int *)((long)&Instrux->Operands[0].Info + uVar8) == 5)) {
          uVar10 = (ulong)*(uint *)((long)&Instrux->Operands[0].Info + uVar8 + 8);
          goto LAB_0015d947;
        }
        uVar8 = uVar8 + 0x20;
      } while ((bVar1 & 0xf) << 5 != uVar8);
    }
  }
  bVar1 = Instrux->ExceptionType;
  if (bVar1 < 0x2b) {
    if ((((bVar1 == 0x17) || (bVar1 == 0x23)) &&
        ((undefined1  [32])((undefined1  [32])Instrux->Operands[0] & (undefined1  [32])0xf) ==
         (undefined1  [32])0x1)) &&
       ((((undefined1  [32])((undefined1  [32])Instrux->Operands[2] & (undefined1  [32])0xf) ==
          (undefined1  [32])0x1 &&
         (NVar7 = 0x80000044,
         Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[2].Info.Register.Reg)) ||
        (((undefined1  [32])((undefined1  [32])Instrux->Operands[3] & (undefined1  [32])0xf) ==
          (undefined1  [32])0x1 &&
         (NVar7 = 0x80000044,
         Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[3].Info.Register.Reg))))))
    goto LAB_0015da1f;
  }
  else if (bVar1 == 0x2b) {
LAB_0015d986:
    NVar3 = Instrux->Operands[0].Info.Register.Reg;
    NVar4 = Instrux->Operands[1].Info.Register.Reg;
    NVar7 = 0x80000043;
    if ((NVar3 == NVar4) ||
       (NVar5 = Instrux->Operands[2].Info.Register.Reg, NVar4 == NVar5 || NVar3 == NVar5))
    goto LAB_0015da1f;
  }
  else if (bVar1 == 0x48) {
    NVar3 = Instrux->Operands[0].Info.Register.Reg;
    NVar7 = 0x80000044;
    if (((NVar3 == 4) || (NVar4 = Instrux->Operands[1].Info.Register.Reg, NVar4 == 4)) ||
       ((NVar3 == NVar4 && ((Instrux->Operands[0].Access.Access & 2) != 0)))) goto LAB_0015da1f;
  }
  else if (bVar1 == 0x31) goto LAB_0015d986;
  NVar7 = 0;
LAB_0015da1f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return NVar7;
}

Assistant:

static NDSTATUS
NdVexExceptionChecks(
    INSTRUX *Instrux
    )
{
    // These checks only apply to XOP/VEX/EVEX encoded instructions.

    // Instructions that don't use VEX/XOP/EVEX vvvv field must set it to 1111b/0 logic, otherwise a #UD will 
    // be generated.
    if ((Instrux->Attributes & ND_FLAG_NOV) && (0 != Instrux->Exs.v))
    {
        return ND_STATUS_VEX_VVVV_MUST_BE_ZERO;
    }

    // Instruction that don't use EVEX.V' field must set to to 1b/0 logic, otherwise a #UD will be generated.
    if ((Instrux->Attributes & ND_FLAG_NOVP) && (0 != Instrux->Exs.vp))
    {
        return ND_STATUS_BAD_EVEX_V_PRIME;
    }

    // VSIB instructions have a restriction: the same vector register can't be used by more than one operand.
    // The exception is SCATTER*, which can use the VSIB reg as two sources.
    if (ND_HAS_VSIB(Instrux) && Instrux->Category != ND_CAT_SCATTER)
    {
        ND_UINT8 usedVects[32] = { 0 };
        ND_UINT32 i;

        for (i = 0; i < Instrux->OperandsCount; i++)
        {
            if (Instrux->Operands[i].Type == ND_OP_REG && Instrux->Operands[i].Info.Register.Type == ND_REG_SSE)
            {
                if (++usedVects[Instrux->Operands[i].Info.Register.Reg] > 1)
                {
                    return ND_STATUS_INVALID_VSIB_REGS;
                }
            }
            else if (Instrux->Operands[i].Type == ND_OP_MEM)
            {
                if (++usedVects[Instrux->Operands[i].Info.Memory.Index] > 1)
                {
                    return ND_STATUS_INVALID_VSIB_REGS;
                }
            }
        }
    }

    // Handle AMX exception class.
    if (Instrux->ExceptionType == ND_EXT_AMX_E4 ||
        Instrux->ExceptionType == ND_EXT_AMX_E10)
    {
        // #UD if srcdest == src1, srcdest == src2 or src1 == src2. All three operands are tile regs.
        if (Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[1].Info.Register.Reg ||
            Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[2].Info.Register.Reg ||
            Instrux->Operands[1].Info.Register.Reg == Instrux->Operands[2].Info.Register.Reg)
        {
            return ND_STATUS_INVALID_TILE_REGS;
        }
    }

    // If E4* or E10* exception class is used (check out AVX512-FP16 instructions), an additional #UD case
    // exists: if the destination register is equal to either of the source registers.
    else if (Instrux->ExceptionType == ND_EXT_E4S || Instrux->ExceptionType == ND_EXT_E10S)
    {
        // Note that operand 0 is the destination, operand 1 is the mask, operand 2 is first source, operand
        // 3 is the second source.
        if (Instrux->Operands[0].Type == ND_OP_REG && Instrux->Operands[2].Type == ND_OP_REG &&
            Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[2].Info.Register.Reg)
        {
            return ND_STATUS_INVALID_DEST_REGS;
        }

        if (Instrux->Operands[0].Type == ND_OP_REG && Instrux->Operands[3].Type == ND_OP_REG &&
            Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[3].Info.Register.Reg)
        {
            return ND_STATUS_INVALID_DEST_REGS;
        }
    }

    // Handle PUSH2/POP2 exceptions, which have restrictions on the destination registers.
    else if (Instrux->ExceptionType == ND_EXT_APX_EVEX_PP2)
    {
        // The registers cannot be RSP for either PUSH2 or POP2.
        if (Instrux->Operands[0].Info.Register.Reg == NDR_RSP ||
            Instrux->Operands[1].Info.Register.Reg == NDR_RSP)
        {
            return ND_STATUS_INVALID_DEST_REGS;
        }

        // The destination registers cannot be the same for POP2.
        if (Instrux->Operands[0].Access.Write &&
            Instrux->Operands[0].Info.Register.Reg == Instrux->Operands[1].Info.Register.Reg)
        {
            return ND_STATUS_INVALID_DEST_REGS;
        }
    }

    return ND_STATUS_SUCCESS;
}